

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VM.cpp
# Opt level: O3

string * __thiscall
(anonymous_namespace)::NumberToStr_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Value *num)

{
  double __x;
  size_t sVar1;
  string *extraout_RAX;
  double dVar2;
  char temp [64];
  char local_58 [72];
  
  if (*(int *)(this + 8) == 2) {
    __x = *(double *)this;
    dVar2 = floor(__x);
    if ((dVar2 != __x) || (NAN(dVar2) || NAN(__x))) {
      snprintf(local_58,0x40,"%g");
    }
    else {
      snprintf(local_58,0x40,"%lld",(long)__x);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar1 = strlen(local_58);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,local_58,local_58 + sVar1);
    return extraout_RAX;
  }
  __assert_fail("num->type_ == luna::ValueT_Number",
                "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/VM.cpp",0xe,
                "std::string (anonymous namespace)::NumberToStr(luna::Value *)");
}

Assistant:

std::string NumberToStr(luna::Value *num)
    {
        assert(num->type_ == luna::ValueT_Number);
        char temp[64];
        if (floor(num->num_) == num->num_)
            snprintf(temp, sizeof(temp), "%lld", static_cast<long long>(num->num_));
        else
            snprintf(temp, sizeof(temp), "%g", num->num_);
        return temp;
    }